

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAtomicRMW(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  PSNodesSeq *pPVar5;
  PSNode *pPVar6;
  PSNode *succ;
  ushort uVar7;
  Instruction *pIVar8;
  type *ptVar9;
  type tVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar11;
  PSNode *M;
  PSNode *ptr;
  Offset cval;
  PSNodesSeq ret;
  PSNode *local_a8;
  PSNode *local_a0;
  Offset local_98;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_90;
  PSNode *local_78;
  initializer_list<dg::pta::PSNode_*> local_70;
  PSNodesSeq local_60;
  PSNode *local_40;
  PSNode *local_38;
  
  pIVar8 = (Instruction *)0x0;
  if (Inst[0x10] == (Instruction)0x40) {
    pIVar8 = Inst;
  }
  uVar1 = *(ushort *)(pIVar8 + 0x12);
  uVar7 = uVar1 >> 4 & 0xf;
  if (2 < uVar7) {
    pPVar5 = createUnknown(this,(Value *)Inst);
    return pPVar5;
  }
  local_a0 = getOperand(this,*(Value **)(pIVar8 + -0x40));
  tVar10 = Offset::UNKNOWN;
  local_98.offset = Offset::UNKNOWN;
  pPVar6 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_a0);
  local_a8 = (PSNode *)0x0;
  if ((uVar1 >> 4 & 0xf) == 0) {
    local_a8 = getOperand(this,*(Value **)(pIVar8 + -0x20));
    succ = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_a8,&local_a0);
    goto LAB_0011fd16;
  }
  if (uVar7 != 2) {
    lVar3 = *(long *)(pIVar8 + -0x20);
    if ((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\x10')) {
      uVar2 = *(uint *)(lVar3 + 0x20);
      ptVar9 = (type *)(lVar3 + 0x18);
      if (0x40 < uVar2) {
        iVar4 = llvm::APInt::countLeadingZerosSlowCase();
        tVar10 = 0xffffffffffffffff;
        if (0x40 < uVar2 - iVar4) goto LAB_0011fca3;
      }
      if (0x40 < uVar2) {
        ptVar9 = (type *)*ptVar9;
      }
      tVar10 = *ptVar9;
    }
LAB_0011fca3:
    local_98.offset = tVar10;
    local_a8 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,dg::Offset&>
                         ((PointerGraph *)this,&local_a0,&local_98);
    SubgraphNode<dg::pta::PSNode>::addSuccessor
              (&pPVar6->super_SubgraphNode<dg::pta::PSNode>,local_a8);
  }
  succ = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                   ((PointerGraph *)this,&local_a8,&local_a0);
  SubgraphNode<dg::pta::PSNode>::addSuccessor(&local_a8->super_SubgraphNode<dg::pta::PSNode>,succ);
LAB_0011fd16:
  local_70._M_array = &local_40;
  local_70._M_len = 2;
  local_40 = pPVar6;
  local_38 = succ;
  PSNodesSeq::PSNodesSeq(&local_60,&local_70);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
            (&local_90,&local_60._nodes);
  local_78 = local_60._repr;
  if (local_60._repr == (PSNode *)0x0) {
    local_60._repr =
         local_90.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish[-1];
  }
  ((local_60._repr)->super_SubgraphNode<dg::pta::PSNode>).user_data = Inst;
  local_70._M_array = (iterator)Inst;
  pVar11 = std::
           _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
           ::_M_emplace<llvm::Value_const*&,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>
                     ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)(this + 0x188),&local_70,&local_90);
  if (local_90.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._nodes.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._nodes.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (PSNodesSeq *)
         ((long)pVar11.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAtomicRMW(const llvm::Instruction *Inst) {
    using namespace llvm;

    const auto *RMW = dyn_cast<AtomicRMWInst>(Inst);
    assert(RMW && "Wrong instruction");

    auto operation = RMW->getOperation();
    if (operation != AtomicRMWInst::Xchg && operation != AtomicRMWInst::Add &&
        operation != AtomicRMWInst::Sub) {
        return createUnknown(Inst);
    }

    auto *ptr = getOperand(RMW->getPointerOperand());
    Offset cval = Offset::UNKNOWN;

    auto *R = PS.create<PSNodeType::LOAD>(ptr);

    PSNode *M = nullptr;
    switch (operation) {
    case AtomicRMWInst::Xchg:
        M = getOperand(RMW->getValOperand());
        break;
    case AtomicRMWInst::Add:
        cval = Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    case AtomicRMWInst::Sub:
        break;
        cval = Offset(0) -
               Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    default:
        assert(false && "Invalid operation");
        abort();
    }
    assert(M);

    auto *W = PS.create<PSNodeType::STORE>(M, ptr);
    if (operation == AtomicRMWInst::Add || operation == AtomicRMWInst::Sub) {
        M->addSuccessor(W);
    }

    PSNodesSeq ret({R, W});
    return addNode(Inst, ret);
}